

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder.c
# Opt level: O0

int ndn_forwarder_receive(ndn_face_intf_t *face,uint8_t *packet,size_t length)

{
  ndn_table_id_t face_id_00;
  undefined1 local_58 [2];
  ndn_table_id_t face_id;
  int ret;
  interest_options_t options;
  size_t name_len;
  uint8_t *name;
  uint8_t *buf;
  uint32_t val_len;
  uint32_t type;
  size_t length_local;
  uint8_t *packet_local;
  ndn_face_intf_t *face_local;
  
  if (face == (ndn_face_intf_t *)0x0) {
    face_id_00 = 0xffff;
  }
  else {
    face_id_00 = face->face_id;
  }
  if (packet == (uint8_t *)0x0) {
    face_local._4_4_ = -0x10;
  }
  else {
    _val_len = length;
    length_local = (size_t)packet;
    packet_local = (uint8_t *)face;
    name = tlv_get_type_length(packet,length,(uint32_t *)((long)&buf + 4),(uint32_t *)&buf);
    if ((ulong)(uint)buf == _val_len - ((long)name - length_local)) {
      if (buf._4_4_ == 5) {
        face_local._4_4_ =
             tlv_interest_get_header
                       ((uint8_t *)length_local,_val_len,(interest_options_t *)local_58,
                        (uint8_t **)&name_len,(size_t *)&options.nonce);
        if (face_local._4_4_ == 0) {
          face_local._4_4_ =
               fwd_on_incoming_interest
                         ((uint8_t *)length_local,_val_len,(interest_options_t *)local_58,
                          (uint8_t *)name_len,options._8_8_,face_id_00);
        }
      }
      else if (buf._4_4_ == 6) {
        face_local._4_4_ =
             tlv_data_get_name((uint8_t *)length_local,_val_len,(uint8_t **)&name_len,
                               (size_t *)&options.nonce);
        if (face_local._4_4_ == 0) {
          face_local._4_4_ =
               fwd_data_pipeline((uint8_t *)length_local,_val_len,(uint8_t *)name_len,options._8_8_,
                                 face_id_00);
        }
      }
      else {
        face_local._4_4_ = -0xc;
      }
    }
    else {
      face_local._4_4_ = -0xd;
    }
  }
  return face_local._4_4_;
}

Assistant:

int
ndn_forwarder_receive(ndn_face_intf_t* face, uint8_t* packet, size_t length)
{
  uint32_t type, val_len;
  uint8_t* buf;
  uint8_t *name;
  size_t name_len;
  interest_options_t options;
  int ret;
  ndn_table_id_t face_id = (face ? face->face_id : NDN_INVALID_ID);

  if (packet == NULL)
    return NDN_INVALID_POINTER;

  buf = tlv_get_type_length(packet, length, &type, &val_len);
  if (val_len != length - (buf - packet))
    return NDN_WRONG_TLV_LENGTH;

  if (type == TLV_Interest) {
    ret = tlv_interest_get_header(packet, length, &options, &name, &name_len);
    if (ret != NDN_SUCCESS)
      return ret;
    return fwd_on_incoming_interest(packet, length, &options, name, name_len, face_id);
  }
  else if(type == TLV_Data) {
    ret = tlv_data_get_name(packet, length, &name, &name_len);
    if (ret != NDN_SUCCESS)
      return ret;
    return fwd_data_pipeline(packet, length, name, name_len, face_id);
  }
  else {
    return NDN_WRONG_TLV_TYPE;
  }
}